

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O3

bool __thiscall axl::zip::ZipReader::openMem(ZipReader *this,void *p,size_t size)

{
  mz_bool mVar1;
  mz_zip_archive *pZip;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_30;
  
  close(this,(int)p);
  pZip = (mz_zip_archive *)operator_new(0x60);
  pZip->m_archive_size = 0;
  pZip->m_central_directory_file_ofs = 0;
  pZip->m_total_files = 0;
  pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;
  *(undefined8 *)&pZip->m_file_offset_alignment = 0;
  pZip->m_pAlloc = (mz_alloc_func)0x0;
  pZip->m_pFree = (mz_free_func)0x0;
  pZip->m_pRealloc = (mz_realloc_func)0x0;
  pZip->m_pAlloc_opaque = (void *)0x0;
  pZip->m_pRead = (mz_file_read_func)0x0;
  pZip->m_pWrite = (mz_file_write_func)0x0;
  pZip->m_pIO_opaque = (void *)0x0;
  pZip->m_pState = (mz_zip_internal_state *)0x0;
  this->m_zip = pZip;
  mVar1 = mz_zip_reader_init_mem(pZip,p,size,0x800);
  if (mVar1 == 0) {
    err::Error::Error((Error *)&local_30,5);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_30);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_30);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  return mVar1 != 0;
}

Assistant:

bool
ZipReader::openMem(
	const void* p,
	size_t size
) {
	close();

	m_zip = new (mem::ZeroInit) mz_zip_archive;
	mz_bool result = mz_zip_reader_init_mem(m_zip, p, size, MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY);
	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}